

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpcompoundpacket.cpp
# Opt level: O1

void __thiscall jrtplib::RTCPCompoundPacket::ClearPacketList(RTCPCompoundPacket *this)

{
  _List_node_base *p_Var1;
  RTPMemoryManager *pRVar2;
  _List_node_base *p_Var3;
  
  for (p_Var3 = (this->rtcppacklist).
                super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>.
                _M_impl._M_node.super__List_node_base._M_next;
      p_Var3 != (_List_node_base *)&this->rtcppacklist; p_Var3 = p_Var3->_M_next) {
    p_Var1 = p_Var3[1]._M_next;
    pRVar2 = (this->super_RTPMemoryObject).mgr;
    if (pRVar2 == (RTPMemoryManager *)0x0) {
      if (p_Var1 != (_List_node_base *)0x0) {
        (**(code **)((long)p_Var1->_M_next + 8))(p_Var1);
      }
    }
    else {
      (**(code **)p_Var1->_M_next)(p_Var1);
      (**(code **)(*(long *)pRVar2 + 0x18))(pRVar2,p_Var1);
    }
  }
  std::__cxx11::list<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>::clear
            (&this->rtcppacklist);
  (this->rtcppackit)._M_node =
       (this->rtcppacklist).
       super__List_base<jrtplib::RTCPPacket_*,_std::allocator<jrtplib::RTCPPacket_*>_>._M_impl.
       _M_node.super__List_node_base._M_next;
  return;
}

Assistant:

void RTCPCompoundPacket::ClearPacketList()
{
	std::list<RTCPPacket *>::const_iterator it;

	for (it = rtcppacklist.begin() ; it != rtcppacklist.end() ; it++)
		RTPDelete(*it,GetMemoryManager());
	rtcppacklist.clear();
	rtcppackit = rtcppacklist.begin();
}